

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

string * complement(string *__return_storage_ptr__,string *sequence)

{
  size_type sVar1;
  size_type sVar2;
  allocator local_21;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
  sVar1 = sequence->_M_string_length;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string complement(string sequence)  {
    string complementString = "";
    for(char base : sequence) {
        if(base=='A'){
            complementString += 'T';
        }else if(base=='T'){
            complementString += 'A';
        }else if(base=='G'){
            complementString += 'C';
        }else if(base=='C'){
            complementString += 'G';
        }else {
            complementString += base;
        }
    }

    return complementString;
}